

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O0

bool __thiscall
cmCTestBuildHandler::FragmentCompare::operator()(FragmentCompare *this,string *l,string *r)

{
  bool bVar1;
  int local_2c;
  string *psStack_28;
  int result;
  string *r_local;
  string *l_local;
  FragmentCompare *this_local;
  
  psStack_28 = r;
  r_local = l;
  l_local = (string *)this;
  bVar1 = cmFileTimeCache::Compare(this->FTC,l,r,&local_2c);
  if ((bVar1) && (local_2c != 0)) {
    this_local._7_1_ = local_2c < 0;
  }
  else {
    this_local._7_1_ = std::operator<(r_local,psStack_28);
  }
  return this_local._7_1_;
}

Assistant:

bool operator()(std::string const& l, std::string const& r) const
  {
    // Order files by modification time.  Use lexicographic order
    // among files with the same time.
    int result;
    if (this->FTC->Compare(l, r, &result) && result != 0) {
      return result < 0;
    }
    return l < r;
  }